

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O1

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  undefined8 *data;
  uint uVar1;
  ring_buffer_size_t rVar2;
  long lVar3;
  OceanWave *ptr;
  undefined8 local_40;
  PaUtilRingBuffer *local_38;
  
  lVar3 = 0;
  memset(outputBuffer,0,framesPerBuffer * 8);
  local_38 = (PaUtilRingBuffer *)((long)userData + 200);
  do {
    data = (undefined8 *)((long)userData + lVar3);
    if (*(long *)((long)userData + lVar3) == 0) {
      rVar2 = PaUtil_GetRingBufferReadAvailable((PaUtilRingBuffer *)((long)userData + 0x88));
      if (rVar2 != 0) {
        local_40 = 0;
        PaUtil_ReadRingBuffer((PaUtilRingBuffer *)((long)userData + 0x88),&local_40,1);
        *data = local_40;
      }
    }
    if ((OceanWave *)*data != (OceanWave *)0x0) {
      uVar1 = GenerateWave((OceanWave *)*data,(float *)outputBuffer,(uint)framesPerBuffer);
      if (uVar1 != 0) {
        PaUtil_WriteRingBuffer(local_38,data,1);
        *data = 0;
      }
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x80);
  return 0;
}

Assistant:

static int patestCallback(const void*                     inputBuffer,
                          void*                           outputBuffer,
                          unsigned long                   framesPerBuffer,
			              const PaStreamCallbackTimeInfo* timeInfo,
			              PaStreamCallbackFlags           statusFlags,
                          void*                           userData)
{
    int i;
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    (void) inputBuffer; /* Prevent "unused variable" warnings. */

    /* Reset output data first */
    memset(out, 0, framesPerBuffer * 2 * sizeof(float));

    for (i = 0; i < 16; ++i)
    {
        /* Consume the input queue */
        if (data->waves[i] == 0 && PaUtil_GetRingBufferReadAvailable(&data->rBufToRT))
        {
            OceanWave* ptr = 0;
            PaUtil_ReadRingBuffer(&data->rBufToRT, &ptr, 1);
            data->waves[i] = ptr;
        }

        if (data->waves[i] != 0)
        {
            if (GenerateWave(data->waves[i], out, framesPerBuffer))
            {
                /* If wave is "done", post it back to the main thread for deletion */
                PaUtil_WriteRingBuffer(&data->rBufFromRT, &data->waves[i], 1);
                data->waves[i] = 0;
            }
        }
    }
    return paContinue;
}